

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sharedbook.c
# Opt level: O2

void vorbis_staticbook_destroy(static_codebook *b)

{
  if (b->allocedp != 0) {
    free(b->quantlist);
    free(b->lengthlist);
    free(b);
    return;
  }
  return;
}

Assistant:

void vorbis_staticbook_destroy(static_codebook *b){
  if(b->allocedp){
    if(b->quantlist)_ogg_free(b->quantlist);
    if(b->lengthlist)_ogg_free(b->lengthlist);
    memset(b,0,sizeof(*b));
    _ogg_free(b);
  } /* otherwise, it is in static memory */
}